

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_fork_server.c
# Opt level: O0

int main(void)

{
  size_t len_00;
  char *pcVar1;
  undefined1 local_ef0 [8];
  mbedtls_pk_context pkey;
  mbedtls_x509_crt srvcert;
  mbedtls_ssl_config conf;
  mbedtls_ssl_context ssl;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  char *pers;
  uchar buf [1024];
  mbedtls_net_context local_20;
  mbedtls_net_context client_fd;
  mbedtls_net_context listen_fd;
  int pid;
  int cnt;
  int len;
  int ret;
  
  listen_fd.fd = 0;
  mbedtls_net_init(&local_20);
  mbedtls_net_init((mbedtls_net_context *)(buf + 0x3fc));
  mbedtls_ssl_init((mbedtls_ssl_context *)&conf.max_major_ver);
  mbedtls_ssl_config_init((mbedtls_ssl_config *)&srvcert.next);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  mbedtls_pk_init((mbedtls_pk_context *)local_ef0);
  mbedtls_x509_crt_init((mbedtls_x509_crt *)&pkey.pk_ctx);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4));
  signal(0x11,(__sighandler_t)0x1);
  printf("\n  . Initial seeding of the random generator...");
  fflush(_stdout);
  len_00 = strlen("ssl_fork_server");
  cnt = mbedtls_ctr_drbg_seed
                  ((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4),mbedtls_entropy_func,
                   &ctr_drbg.p_entropy,(uchar *)"ssl_fork_server",len_00);
  if (cnt == 0) {
    printf(" ok\n");
    printf("  . Loading the server cert. and key...");
    fflush(_stdout);
    cnt = mbedtls_x509_crt_parse
                    ((mbedtls_x509_crt *)&pkey.pk_ctx,(uchar *)mbedtls_test_srv_crt,0x4ad);
    if (cnt == 0) {
      cnt = mbedtls_x509_crt_parse
                      ((mbedtls_x509_crt *)&pkey.pk_ctx,
                       (uchar *)
                       "-----BEGIN CERTIFICATE-----\r\nMIIDhzCCAm+gAwIBAgIBADANBgkqhkiG9w0BAQUFADA7MQswCQYDVQQGEwJOTDER\r\nMA8GA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwHhcN\r\nMTEwMjEyMTQ0NDAwWhcNMjEwMjEyMTQ0NDAwWjA7MQswCQYDVQQGEwJOTDERMA8G\r\nA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwggEiMA0G\r\nCSqGSIb3DQEBAQUAA4IBDwAwggEKAoIBAQDA3zf8F7vglp0/ht6WMn1EpRagzSHx\r\nmdTs6st8GFgIlKXsm8WL3xoemTiZhx57wI053zhdcHgH057Zk+i5clHFzqMwUqny\r\n50BwFMtEonILwuVA+T7lpg6z+exKY8C4KQB0nFc7qKUEkHHxvYPZP9al4jwqj+8n\r\nYMPGn8u67GB9t+aEMr5P+1gmIgNb1LTV+/Xjli5wwOQuvfwu7uJBVcA0Ln0kcmnL\r\nR7EUQIN9Z/SG9jGr8XmksrUuEvmEF/Bibyc+E1ixVA0hmnM3oTDPb5Lc9un8rNsu\r\nKNF+AksjoBXyOGVkCeoMbo4bF6BxyLObyavpw/LPh5aPgAIynplYb6LVAgMBAAGj\r\ngZUwgZIwDAYDVR0TBAUwAwEB/zAdBgNVHQ4EFgQUtFrkpbPe0lL2udWmlQ/rPrzH\r\n/f8wYwYDVR0jBFwwWoAUtFrkpbPe0lL2udWmlQ/rPrzH/f+hP6Q9MDsxCzAJBgNV\r\nBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEZMBcGA1UEAxMQUG9sYXJTU0wgVGVz\r\ndCBDQYIBADANBgkqhkiG9w0BAQUFAAOCAQEAuP1U2ABUkIslsCfdlc2i94QHHYeJ\r\nSsR4EdgHtdciUI5I62J6Mom+Y0dT/7a+8S6MVMCZP6C5NyNyXw1GWY/YR82XTJ8H\r\nDBJiCTok5DbZ6SzaONBzdWHXwWwmi5vg1dxn7YxrM9d0IjxM27WNKs4sDQhZBQkF\r\npjmfs2cb4oPl4Y9T9meTx/lvdkRYEug61Jfn6cA+qHpyPYdTH+UshITnmp5/Ztkf\r\nm/UTSLBNFNHesiTZeH31NcxYGdHSme9Nc/gfidRa0FLOCfWxRlFqAI47zG9jAQCZ\r\n7Z2mCGDNMhjQc+BYcdnl0lPXjdDK6V0qCg1dVewhUBcW5gZKzV7e9+DpVA==\r\n-----END CERTIFICATE-----\r\n-----BEGIN CERTIFICATE-----\r\nMIICUjCCAdegAwIBAgIJAMFD4n5iQ8zoMAoGCCqGSM49BAMCMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTAeFw0xMzA5MjQxNTQ5NDhaFw0yMzA5MjIxNTQ5NDhaMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTB2MBAGByqGSM49AgEGBSuBBAAiA2IABMPaKzRBN1gvh1b+/Im6KUNLTuBu\r\nww5XUzM5WNRStJGVOQsj318XJGJI/BqVKc4sLYfCiFKAr9ZqqyHduNMcbli4yuiy\r\naY7zQa0pw7RfdadHb9UZKVVpmlM7ILRmFmAzHqOBoDCBnTAdBgNVHQ4EFgQUnW0g\r\nJEkBPyvLeLUZvH4kydv7NnwwbgYDVR0jBGcwZYAUnW0gJEkBPyvLeLUZvH4kydv7\r\nNnyhQqRAMD4xCzAJBgNVBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UE\r\nAxMTUG9sYXJzc2wgVGVzdCBFQyBDQYIJAMFD4n5iQ8zoMAwGA1UdEwQFMAMBAf8w\r\nCgYIKoZIzj0EAwIDaQAwZgIxAMO0YnNWKJUAfXgSJtJxexn4ipg+k..." /* TRUNCATED STRING LITERAL */
                       ,0x88d);
      if (cnt == 0) {
        cnt = mbedtls_pk_parse_key
                        ((mbedtls_pk_context *)local_ef0,(uchar *)mbedtls_test_srv_key,0x6ab,
                         (uchar *)0x0,0);
        if (cnt == 0) {
          printf(" ok\n");
          printf("  . Configuring SSL...");
          fflush(_stdout);
          cnt = mbedtls_ssl_config_defaults((mbedtls_ssl_config *)&srvcert.next,1,0,0);
          if (cnt == 0) {
            mbedtls_ssl_conf_rng
                      ((mbedtls_ssl_config *)&srvcert.next,mbedtls_ctr_drbg_random,
                       ssl.peer_verify_data + 4);
            mbedtls_ssl_conf_dbg((mbedtls_ssl_config *)&srvcert.next,my_debug,_stdout);
            mbedtls_ssl_conf_ca_chain
                      ((mbedtls_ssl_config *)&srvcert.next,(mbedtls_x509_crt *)srvcert.sig_opts,
                       (mbedtls_x509_crl *)0x0);
            cnt = mbedtls_ssl_conf_own_cert
                            ((mbedtls_ssl_config *)&srvcert.next,(mbedtls_x509_crt *)&pkey.pk_ctx,
                             (mbedtls_pk_context *)local_ef0);
            if (cnt == 0) {
              printf(" ok\n");
              printf("  . Bind on https://localhost:4433/ ...");
              fflush(_stdout);
              cnt = mbedtls_net_bind(&local_20,(char *)0x0,"4433",0);
              if (cnt == 0) {
                printf(" ok\n");
                do {
                  mbedtls_net_init((mbedtls_net_context *)(buf + 0x3fc));
                  mbedtls_ssl_init((mbedtls_ssl_context *)&conf.max_major_ver);
                  printf("  . Waiting for a remote connection ...\n");
                  fflush(_stdout);
                  cnt = mbedtls_net_accept(&local_20,(mbedtls_net_context *)(buf + 0x3fc),
                                           (void *)0x0,0,(size_t *)0x0);
                  if (cnt != 0) {
                    printf(" failed!  mbedtls_net_accept returned %d\n\n",(ulong)(uint)cnt);
                    goto LAB_0010fc2f;
                  }
                  printf("  . Forking to handle connection ...");
                  fflush(_stdout);
                  client_fd.fd = fork();
                  if (client_fd.fd < 0) {
                    printf(" failed!  fork returned %d\n\n",(ulong)(uint)client_fd.fd);
                    goto LAB_0010fc2f;
                  }
                  if (client_fd.fd == 0) {
                    mbedtls_net_init(&local_20);
                    client_fd.fd = getpid();
                    printf("pid %d: Setting up the SSL data.\n",(ulong)(uint)client_fd.fd);
                    fflush(_stdout);
                    cnt = mbedtls_ctr_drbg_reseed
                                    ((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4),
                                     (uchar *)"child",5);
                    if (cnt != 0) {
                      printf("pid %d: SSL setup failed!  mbedtls_ctr_drbg_reseed returned %d\n\n",
                             (ulong)(uint)client_fd.fd,(ulong)(uint)cnt);
                      goto LAB_0010fc2f;
                    }
                    cnt = mbedtls_ssl_setup((mbedtls_ssl_context *)&conf.max_major_ver,
                                            (mbedtls_ssl_config *)&srvcert.next);
                    if (cnt != 0) {
                      printf("pid %d: SSL setup failed!  mbedtls_ssl_setup returned %d\n\n",
                             (ulong)(uint)client_fd.fd,(ulong)(uint)cnt);
                      goto LAB_0010fc2f;
                    }
                    mbedtls_ssl_set_bio((mbedtls_ssl_context *)&conf.max_major_ver,buf + 0x3fc,
                                        mbedtls_net_send,mbedtls_net_recv,
                                        (mbedtls_ssl_recv_timeout_t *)0x0);
                    printf("pid %d: SSL setup ok\n",(ulong)(uint)client_fd.fd);
                    printf("pid %d: Performing the SSL/TLS handshake.\n",(ulong)(uint)client_fd.fd);
                    fflush(_stdout);
                    goto LAB_0010f9d1;
                  }
                  printf(" ok\n");
                  cnt = mbedtls_ctr_drbg_reseed
                                  ((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4),
                                   (uchar *)"parent",6);
                } while (cnt == 0);
                printf(" failed!  mbedtls_ctr_drbg_reseed returned %d\n\n",(ulong)(uint)cnt);
              }
              else {
                printf(" failed!  mbedtls_net_bind returned %d\n\n",(ulong)(uint)cnt);
              }
            }
            else {
              printf(" failed!  mbedtls_ssl_conf_own_cert returned %d\n\n",(ulong)(uint)cnt);
            }
          }
          else {
            printf(" failed!  mbedtls_ssl_config_defaults returned %d\n\n",(ulong)(uint)cnt);
          }
        }
        else {
          printf(" failed!  mbedtls_pk_parse_key returned %d\n\n",(ulong)(uint)cnt);
        }
      }
      else {
        printf(" failed!  mbedtls_x509_crt_parse returned %d\n\n",(ulong)(uint)cnt);
      }
    }
    else {
      printf(" failed!  mbedtls_x509_crt_parse returned %d\n\n",(ulong)(uint)cnt);
    }
  }
  else {
    printf(" failed!  mbedtls_ctr_drbg_seed returned %d\n\n",(ulong)(uint)cnt);
  }
  goto LAB_0010fc2f;
  while ((cnt == 0xffff9700 || (cnt == 0xffff9780))) {
LAB_0010f9d1:
    cnt = mbedtls_ssl_handshake((mbedtls_ssl_context *)&conf.max_major_ver);
    if (cnt == 0) {
      printf("pid %d: SSL handshake ok\n",(ulong)(uint)client_fd.fd);
      printf("pid %d: Start reading from client.\n");
      fflush(_stdout);
      goto LAB_0010fa43;
    }
  }
  printf("pid %d: SSL handshake failed!  mbedtls_ssl_handshake returned %d\n\n",
         (ulong)(uint)client_fd.fd,(ulong)(uint)cnt);
  goto LAB_0010fc2f;
  while (printf("pid %d: %d bytes read\n\n%s",(ulong)(uint)client_fd.fd,(ulong)(uint)cnt,&pers),
        cnt < 1) {
LAB_0010fa43:
    do {
      do {
        memset(&pers,0,0x400);
        cnt = mbedtls_ssl_read((mbedtls_ssl_context *)&conf.max_major_ver,(uchar *)&pers,0x3ff);
      } while (cnt == 0xffff9700);
    } while (cnt == 0xffff9780);
    if (cnt < 1) {
      if (cnt == 0xffff8780) {
        printf("pid %d: connection was closed gracefully\n",(ulong)(uint)client_fd.fd);
      }
      else if (cnt == 0xffffffb0) {
        printf("pid %d: connection was reset by peer\n",(ulong)(uint)client_fd.fd);
      }
      else {
        printf("pid %d: mbedtls_ssl_read returned %d\n",(ulong)(uint)client_fd.fd,(ulong)(uint)cnt);
      }
      break;
    }
  }
  printf("pid %d: Start writing to client.\n",(ulong)(uint)client_fd.fd);
  fflush(_stdout);
  pcVar1 = mbedtls_ssl_get_ciphersuite((mbedtls_ssl_context *)&conf.max_major_ver);
  pid = sprintf((char *)&pers,
                "HTTP/1.0 200 OK\r\nContent-Type: text/html\r\n\r\n<h2>mbed TLS Test Server</h2>\r\n<p>Successful connection using: %s</p>\r\n"
                ,pcVar1);
  while (listen_fd.fd < 100) {
    while (cnt = mbedtls_ssl_write((mbedtls_ssl_context *)&conf.max_major_ver,(uchar *)&pers,
                                   (long)pid), cnt < 1) {
      if (cnt == 0xffffffb0) {
        printf("pid %d: Write failed!  peer closed the connection\n\n",(ulong)(uint)client_fd.fd);
        goto LAB_0010fc2f;
      }
      if ((cnt != 0xffff9700) && (cnt != 0xffff9780)) {
        printf("pid %d: Write failed!  mbedtls_ssl_write returned %d\n\n",(ulong)(uint)client_fd.fd,
               (ulong)(uint)cnt);
        goto LAB_0010fc2f;
      }
    }
    printf("pid %d: %d bytes written\n\n%s\n",(ulong)(uint)client_fd.fd,(ulong)(uint)cnt,&pers);
    mbedtls_net_usleep(1000000);
    listen_fd.fd = listen_fd.fd + 1;
    pid = cnt;
  }
  mbedtls_ssl_close_notify((mbedtls_ssl_context *)&conf.max_major_ver);
LAB_0010fc2f:
  mbedtls_net_free((mbedtls_net_context *)(buf + 0x3fc));
  mbedtls_net_free(&local_20);
  mbedtls_x509_crt_free((mbedtls_x509_crt *)&pkey.pk_ctx);
  mbedtls_pk_free((mbedtls_pk_context *)local_ef0);
  mbedtls_ssl_free((mbedtls_ssl_context *)&conf.max_major_ver);
  mbedtls_ssl_config_free((mbedtls_ssl_config *)&srvcert.next);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4));
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return cnt;
}

Assistant:

int main( void )
{
    int ret, len, cnt = 0, pid;
    mbedtls_net_context listen_fd, client_fd;
    unsigned char buf[1024];
    const char *pers = "ssl_fork_server";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_x509_crt srvcert;
    mbedtls_pk_context pkey;

    mbedtls_net_init( &listen_fd );
    mbedtls_net_init( &client_fd );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
    mbedtls_entropy_init( &entropy );
    mbedtls_pk_init( &pkey );
    mbedtls_x509_crt_init( &srvcert );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    signal( SIGCHLD, SIG_IGN );

    /*
     * 0. Initial seeding of the RNG
     */
    mbedtls_printf( "\n  . Initial seeding of the random generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_ctr_drbg_seed returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1. Load the certificates and private RSA key
     */
    mbedtls_printf( "  . Loading the server cert. and key..." );
    fflush( stdout );

    /*
     * This demonstration program uses embedded test certificates.
     * Instead, you may want to use mbedtls_x509_crt_parse_file() to read the
     * server and CA certificates, as well as mbedtls_pk_parse_keyfile().
     */
    ret = mbedtls_x509_crt_parse( &srvcert, (const unsigned char *) mbedtls_test_srv_crt,
                          mbedtls_test_srv_crt_len );
    if( ret != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_x509_crt_parse returned %d\n\n", ret );
        goto exit;
    }

    ret = mbedtls_x509_crt_parse( &srvcert, (const unsigned char *) mbedtls_test_cas_pem,
                          mbedtls_test_cas_pem_len );
    if( ret != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_x509_crt_parse returned %d\n\n", ret );
        goto exit;
    }

    ret =  mbedtls_pk_parse_key( &pkey, (const unsigned char *) mbedtls_test_srv_key,
                          mbedtls_test_srv_key_len, NULL, 0 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_pk_parse_key returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1b. Prepare SSL configuration
     */
    mbedtls_printf( "  . Configuring SSL..." );
    fflush( stdout );

    if( ( ret = mbedtls_ssl_config_defaults( &conf,
                    MBEDTLS_SSL_IS_SERVER,
                    MBEDTLS_SSL_TRANSPORT_STREAM,
                    MBEDTLS_SSL_PRESET_DEFAULT ) ) != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_ssl_config_defaults returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );
    mbedtls_ssl_conf_dbg( &conf, my_debug, stdout );

    mbedtls_ssl_conf_ca_chain( &conf, srvcert.next, NULL );
    if( ( ret = mbedtls_ssl_conf_own_cert( &conf, &srvcert, &pkey ) ) != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_ssl_conf_own_cert returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 2. Setup the listening TCP socket
     */
    mbedtls_printf( "  . Bind on https://localhost:4433/ ..." );
    fflush( stdout );

    if( ( ret = mbedtls_net_bind( &listen_fd, NULL, "4433", MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed!  mbedtls_net_bind returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    while( 1 )
    {
        /*
         * 3. Wait until a client connects
         */
        mbedtls_net_init( &client_fd );
        mbedtls_ssl_init( &ssl );

        mbedtls_printf( "  . Waiting for a remote connection ...\n" );
        fflush( stdout );

        if( ( ret = mbedtls_net_accept( &listen_fd, &client_fd,
                                        NULL, 0, NULL ) ) != 0 )
        {
            mbedtls_printf( " failed!  mbedtls_net_accept returned %d\n\n", ret );
            goto exit;
        }

        /*
         * 3.5. Forking server thread
         */

        mbedtls_printf( "  . Forking to handle connection ..." );
        fflush( stdout );

        pid = fork();

        if( pid < 0 )
        {
            mbedtls_printf(" failed!  fork returned %d\n\n", pid );
            goto exit;
        }

        if( pid != 0 )
        {
            mbedtls_printf( " ok\n" );

            if( ( ret = mbedtls_ctr_drbg_reseed( &ctr_drbg,
                                         (const unsigned char *) "parent",
                                         6 ) ) != 0 )
            {
                mbedtls_printf( " failed!  mbedtls_ctr_drbg_reseed returned %d\n\n", ret );
                goto exit;
            }

            continue;
        }

        mbedtls_net_init( &listen_fd );

        pid = getpid();

        /*
         * 4. Setup stuff
         */
        mbedtls_printf( "pid %d: Setting up the SSL data.\n", pid );
        fflush( stdout );

        if( ( ret = mbedtls_ctr_drbg_reseed( &ctr_drbg,
                                     (const unsigned char *) "child",
                                     5 ) ) != 0 )
        {
            mbedtls_printf(
                    "pid %d: SSL setup failed!  mbedtls_ctr_drbg_reseed returned %d\n\n",
                    pid, ret );
            goto exit;
        }

        if( ( ret = mbedtls_ssl_setup( &ssl, &conf ) ) != 0 )
        {
            mbedtls_printf(
                    "pid %d: SSL setup failed!  mbedtls_ssl_setup returned %d\n\n",
                    pid, ret );
            goto exit;
        }

        mbedtls_ssl_set_bio( &ssl, &client_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

        mbedtls_printf( "pid %d: SSL setup ok\n", pid );

        /*
         * 5. Handshake
         */
        mbedtls_printf( "pid %d: Performing the SSL/TLS handshake.\n", pid );
        fflush( stdout );

        while( ( ret = mbedtls_ssl_handshake( &ssl ) ) != 0 )
        {
            if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
            {
                mbedtls_printf(
                        "pid %d: SSL handshake failed!  mbedtls_ssl_handshake returned %d\n\n",
                        pid, ret );
                goto exit;
            }
        }

        mbedtls_printf( "pid %d: SSL handshake ok\n", pid );

        /*
         * 6. Read the HTTP Request
         */
        mbedtls_printf( "pid %d: Start reading from client.\n", pid );
        fflush( stdout );

        do
        {
            len = sizeof( buf ) - 1;
            memset( buf, 0, sizeof( buf ) );
            ret = mbedtls_ssl_read( &ssl, buf, len );

            if( ret == MBEDTLS_ERR_SSL_WANT_READ || ret == MBEDTLS_ERR_SSL_WANT_WRITE )
                continue;

            if( ret <= 0 )
            {
                switch( ret )
                {
                    case MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY:
                        mbedtls_printf( "pid %d: connection was closed gracefully\n", pid );
                        break;

                    case MBEDTLS_ERR_NET_CONN_RESET:
                        mbedtls_printf( "pid %d: connection was reset by peer\n", pid );
                        break;

                    default:
                        mbedtls_printf( "pid %d: mbedtls_ssl_read returned %d\n", pid, ret );
                        break;
                }

                break;
            }

            len = ret;
            mbedtls_printf( "pid %d: %d bytes read\n\n%s", pid, len, (char *) buf );

            if( ret > 0 )
                break;
        }
        while( 1 );

        /*
         * 7. Write the 200 Response
         */
        mbedtls_printf( "pid %d: Start writing to client.\n", pid );
        fflush( stdout );

        len = sprintf( (char *) buf, HTTP_RESPONSE,
                mbedtls_ssl_get_ciphersuite( &ssl ) );

        while( cnt++ < 100 )
        {
            while( ( ret = mbedtls_ssl_write( &ssl, buf, len ) ) <= 0 )
            {
                if( ret == MBEDTLS_ERR_NET_CONN_RESET )
                {
                    mbedtls_printf(
                            "pid %d: Write failed!  peer closed the connection\n\n", pid );
                    goto exit;
                }

                if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
                {
                    mbedtls_printf(
                            "pid %d: Write failed!  mbedtls_ssl_write returned %d\n\n",
                            pid, ret );
                    goto exit;
                }
            }
            len = ret;
            mbedtls_printf( "pid %d: %d bytes written\n\n%s\n", pid, len, (char *) buf );

            mbedtls_net_usleep( 1000000 );
        }

        mbedtls_ssl_close_notify( &ssl );
        goto exit;
    }

exit:
    mbedtls_net_free( &client_fd );
    mbedtls_net_free( &listen_fd );

    mbedtls_x509_crt_free( &srvcert );
    mbedtls_pk_free( &pkey );
    mbedtls_ssl_free( &ssl );
    mbedtls_ssl_config_free( &conf );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}